

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
string_assertion_test::iu_StrCaseTest_x_iutest_x_EqString_Test<char>::
iu_StrCaseTest_x_iutest_x_EqString_Test(iu_StrCaseTest_x_iutest_x_EqString_Test<char> *this)

{
  iu_StrCaseTest_x_iutest_x_EqString_Test<char> *this_local;
  
  StrCaseTest<char>::StrCaseTest(&this->super_StrCaseTest<char>);
  (this->super_StrCaseTest<char>).super_StrTest<char>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_StrCaseTest_x_iutest_x_EqString_Test_0061ac90;
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STRCASEEQ(test1, test2);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASEEQ(test1, test2);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STRCASEEQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASEEQ(test1, test2);
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, test2);
}